

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.h
# Opt level: O0

void yyml::nn::Multiply<double>(Variable<double> *va,Variable<double> *vb,Variable<double> *result)

{
  initializer_list<yyml::nn::Autograd<double>_*> __l;
  size_t sVar1;
  ulong local_68;
  size_t i;
  Autograd<double> *local_58;
  iterator local_50;
  undefined8 local_48;
  type local_40;
  Variable<double> *local_20;
  Variable<double> *result_local;
  Variable<double> *vb_local;
  Variable<double> *va_local;
  
  local_20 = result;
  result_local = vb;
  vb_local = va;
  std::
  bind<void(&)(yyml::nn::Variable<double>*,yyml::nn::Variable<double>*,yyml::nn::Variable<double>*),yyml::nn::Variable<double>*&,yyml::nn::Variable<double>*&,yyml::nn::Variable<double>*&>
            (&local_40,MultiplyBackward<double>,&vb_local,&result_local,&local_20);
  std::function<void()>::operator=((function<void()> *)&(local_20->autograd_).backward_fn,&local_40)
  ;
  i = (size_t)&vb_local->autograd_;
  local_58 = &result_local->autograd_;
  local_50 = (iterator)&i;
  local_48 = 2;
  __l._M_len = 2;
  __l._M_array = local_50;
  std::vector<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>::
  operator=(&(local_20->autograd_).next,__l);
  local_68 = 0;
  while( true ) {
    sVar1 = Tensor<double>::total(&vb_local->values_);
    if (sVar1 <= local_68) break;
    (local_20->values_).data_[local_68] =
         (vb_local->values_).data_[local_68] * (result_local->values_).data_[local_68];
    local_68 = local_68 + 1;
  }
  return;
}

Assistant:

void Multiply(Variable<Type>* va, Variable<Type>* vb, Variable<Type>* result) {
  result->autograd_.backward_fn =
      std::bind(MultiplyBackward<Type>, va, vb, result);
  result->autograd_.next = {&va->autograd_, &vb->autograd_};
  for (size_t i = 0; i < va->values_.total(); i++) {
    result->values_.data_[i] = va->values_.data_[i] * vb->values_.data_[i];
  }
}